

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

void normalize(lzma_mf *mf)

{
  uint uVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  
  if (mf->offset + mf->read_pos == -1) {
    uVar3 = ~mf->cyclic_size;
    uVar4 = mf->sons_count + mf->hash_size_sum;
    if (uVar4 != 0) {
      puVar2 = mf->hash;
      uVar5 = 0;
      do {
        uVar1 = puVar2[uVar5];
        uVar6 = uVar1 - uVar3;
        if (uVar1 < uVar3) {
          uVar6 = 0;
        }
        puVar2[uVar5] = uVar6;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    mf->offset = mf->offset - uVar3;
    return;
  }
  __assert_fail("mf->read_pos + mf->offset == MUST_NORMALIZE_POS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0x78,"void normalize(lzma_mf *)");
}

Assistant:

static void
normalize(lzma_mf *mf)
{
	uint32_t i;
	uint32_t subvalue;
	uint32_t count;
	uint32_t *hash;

	assert(mf->read_pos + mf->offset == MUST_NORMALIZE_POS);

	// In future we may not want to touch the lowest bits, because there
	// may be match finders that use larger resolution than one byte.
	subvalue = (MUST_NORMALIZE_POS - mf->cyclic_size);
				// & (~(UINT32_C(1) << 10) - 1);

	count = mf->hash_size_sum + mf->sons_count;
	hash = mf->hash;

	for (i = 0; i < count; ++i) {
		// If the distance is greater than the dictionary size,
		// we can simply mark the hash element as empty.
		//
		// NOTE: Only the first mf->hash_size_sum elements are
		// initialized for sure. There may be uninitialized elements
		// in mf->son. Since we go through both mf->hash and
		// mf->son here in normalization, Valgrind may complain
		// that the "if" below depends on uninitialized value. In
		// this case it is safe to ignore the warning. See also the
		// comments in lz_encoder_init() in lz_encoder.c.
		if (hash[i] <= subvalue)
			hash[i] = EMPTY_HASH_VALUE;
		else
			hash[i] -= subvalue;
	}

	// Update offset to match the new locations.
	mf->offset -= subvalue;

	return;
}